

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLNotationDecl.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XMLNotationDecl::isSerializable(XMLNotationDecl *this)

{
  XMLNotationDecl *this_local;
  
  return true;
}

Assistant:

void XMLNotationDecl::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {
        serEng.writeSize (fId);
        serEng<<fNameSpaceId;
        serEng.writeString(fName);
        serEng.writeString(fPublicId);
        serEng.writeString(fSystemId);
        serEng.writeString(fBaseURI);
    }
    else
    {
        serEng.readSize (fId);
        serEng>>fNameSpaceId;
        serEng.readString(fName);
        serEng.readString(fPublicId);
        serEng.readString(fSystemId);
        serEng.readString(fBaseURI);
    }
}